

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_memio.h
# Opt level: O0

bool __thiscall Kumu::MemIOReader::ReadUi16BE(MemIOReader *this,ui16_t *i)

{
  bool bVar1;
  unsigned_short i_00;
  ui16_t uVar2;
  ui16_t *i_local;
  MemIOReader *this_local;
  
  if (i == (ui16_t *)0x0) {
    __assert_fail("i",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_memio.h"
                  ,0xba,"bool Kumu::MemIOReader::ReadUi16BE(ui16_t *)");
  }
  bVar1 = (ulong)this->m_size + 2 <= (ulong)this->m_capacity;
  if (bVar1) {
    i_00 = cp2i<unsigned_short>(this->m_p + this->m_size);
    uVar2 = Swap2(i_00);
    *i = uVar2;
    this->m_size = this->m_size + 2;
  }
  return bVar1;
}

Assistant:

inline bool ReadUi16BE(ui16_t* i) {
	assert(i);
	if ( ( m_size + sizeof(ui16_t) ) > m_capacity )
	  return false;

	*i = KM_i16_BE(cp2i<ui16_t>(m_p + m_size));
	m_size += sizeof(ui16_t);
	return true;
      }